

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O2

void __thiscall
jsonip::detail::struct_helper<P>::member_writer<jsonip::writer<false>>::operator()
          (member_writer<jsonip::writer<false>> *this,integral_c<int,_1> *param_1)

{
  writer<false>::new_member(*(writer<false> **)this,"y");
  arithmetic_helper<int>::write<jsonip::writer<false>>
            (*(writer<false> **)this,*(int *)(*(long *)(this + 8) + 4));
  return;
}

Assistant:

void operator()(const N&)
            {
                typedef boost::fusion::extension::struct_member_name<
                    T, N::value> name_t;
                typedef typename boost::fusion::result_of::value_at<T, N>::type
                    current_t;
                typedef typename calculate_helper<current_t>::type helper_t;

                w.new_member(name_t::call());
                helper_t::write(w, boost::fusion::at<N>(t));
            }